

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O0

void __thiscall iqnet::Socket::set_non_blocking(Socket *this,bool flag)

{
  int iVar1;
  network_error *this_00;
  allocator<char> local_39;
  string local_38;
  undefined1 local_11;
  Socket *pSStack_10;
  bool flag_local;
  Socket *this_local;
  
  if ((flag) && (local_11 = flag, pSStack_10 = this, iVar1 = fcntl(this->sock,4,0x800), iVar1 == -1)
     ) {
    this_00 = (network_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Socket::set_non_blocking",&local_39);
    network_error::network_error(this_00,&local_38,true,0);
    __cxa_throw(this_00,&network_error::typeinfo,network_error::~network_error);
  }
  return;
}

Assistant:

void Socket::set_non_blocking( bool flag )
{
#ifdef WIN32
  unsigned long f = flag ? 1 : 0;
  if( ioctlsocket(sock, FIONBIO, &f) != 0 )
    throw network_error( "Socket::set_non_blocking");
#else
  if( !flag )
    return;

  if( fcntl( sock, F_SETFL, O_NDELAY ) == -1 )
    throw network_error( "Socket::set_non_blocking" );
#endif //WIN32
}